

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O1

void RigidBodyDynamics::ForwardDynamicsLagrangian
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,VectorNd *QDDot,
               LinearSolver linear_solver,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext,MatrixNd *H,
               VectorNd *C)

{
  uint uVar1;
  undefined1 auVar2 [16];
  DenseStorage<double,__1,__1,__1,_0> *this;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  undefined8 *puVar3;
  ulong rows;
  long lVar4;
  ActualDstType actualDst;
  assign_op<double,_double> local_139;
  VectorNd *local_138;
  VectorNd *local_130;
  VectorNd *local_128;
  SrcXprType local_120;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_110;
  double *local_70;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_68;
  Index local_60;
  Index local_50;
  VectorNd *local_40;
  
  this = (DenseStorage<double,__1,__1,__1,_0> *)H;
  local_138 = QDDot;
  local_128 = QDot;
  if (H == (MatrixNd *)0x0) {
    this = (DenseStorage<double,__1,__1,__1,_0> *)operator_new(0x18);
    rows = CONCAT44(0,model->dof_count);
    this->m_data = (double *)0x0;
    this->m_rows = 0;
    this->m_cols = 0;
    if ((this->m_rows != rows) || (this->m_cols != rows)) {
      if ((rows != 0) &&
         (auVar2._8_8_ = 0, auVar2._0_8_ = rows,
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0) < rows)) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = std::operator<<;
        __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(this,rows * rows,rows,rows);
    }
    lVar4 = this->m_rows * this->m_cols;
    if (0 < lVar4) {
      memset(this->m_data,0,lVar4 * 8);
    }
  }
  this_00 = &C->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  local_130 = Tau;
  if (C == (VectorNd *)0x0) {
    this_00 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)operator_new(0x10);
    uVar1 = model->dof_count;
    (this_00->m_storage).m_data = (double *)0x0;
    (this_00->m_storage).m_rows = 0;
    if ((this_00->m_storage).m_rows != (ulong)uVar1) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (this_00,(ulong)uVar1,1);
    }
    lVar4 = (this_00->m_storage).m_rows;
    if (0 < lVar4) {
      memset((this_00->m_storage).m_data,0,lVar4 << 3);
    }
  }
  lVar4 = (local_138->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if (0 < lVar4) {
    memset((local_138->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data,0,lVar4 << 3);
  }
  InverseDynamics(model,Q,local_128,local_138,(VectorNd *)this_00,f_ext);
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)this,false);
  switch(linear_solver) {
  case LinearSolverPartialPivLU:
    Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    local_60 = (this_00->m_storage).m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)&stack0xffffffffffffff90;
    local_50 = -0x4010000000000000;
    local_40 = local_130;
    local_120.m_dec = &local_110;
    local_68 = this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(local_138,(SrcXprType *)&local_120,&local_139);
    break;
  case LinearSolverColPivHouseholderQR:
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    local_60 = (this_00->m_storage).m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)&stack0xffffffffffffff90;
    local_50 = -0x4010000000000000;
    local_40 = local_130;
    local_120.m_dec = &local_110;
    local_68 = this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(local_138,&local_120,&local_139);
    free(local_110.m_colNormsDirect.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_110.m_colNormsUpdated.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_110.m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
         m_data);
    free(local_110.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>
         .m_storage.m_data);
    break;
  case LinearSolverHouseholderQR:
    Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    local_60 = (this_00->m_storage).m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)&stack0xffffffffffffff90;
    local_50 = -0x4010000000000000;
    local_40 = local_130;
    local_120.m_dec = &local_110;
    local_68 = this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(local_138,(SrcXprType *)&local_120,&local_139);
    break;
  case LinearSolverLLT:
    Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&stack0xffffffffffffff90,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    local_110.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = (this_00->m_storage).m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)&local_110;
    local_110.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = -0x4010000000000000;
    local_110.m_colsPermutation.m_indices.
    super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = (Index)local_130;
    local_120.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&stack0xffffffffffffff90;
    local_110.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = (Index)this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(local_138,(SrcXprType *)&local_120,&local_139);
    goto LAB_00132c66;
  default:
    goto switchD_00132aab_default;
  }
  free(local_110.m_colsPermutation.m_indices.
       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_110.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  local_70 = local_110.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
LAB_00132c66:
  free(local_70);
switchD_00132aab_default:
  if (C == (VectorNd *)0x0) {
    free((this_00->m_storage).m_data);
    operator_delete(this_00,0x10);
  }
  if (H == (MatrixNd *)0x0) {
    free(this->m_data);
    operator_delete(this,0x18);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsLagrangian (
		Model &model,
		const VectorNd &Q,
		const VectorNd &QDot,
		const VectorNd &Tau,
		VectorNd &QDDot,
		Math::LinearSolver linear_solver,
		std::vector<SpatialVector> *f_ext,
		Math::MatrixNd *H,
		Math::VectorNd *C
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	bool free_H = false;
	bool free_C = false;

	if (H == NULL) {
		H = new MatrixNd (MatrixNd::Zero(model.dof_count, model.dof_count));
		free_H = true;
	}

	if (C == NULL) {
		C = new VectorNd (VectorNd::Zero(model.dof_count));
		free_C = true;
	}

	// we set QDDot to zero to compute C properly with the InverseDynamics
	// method.
	QDDot.setZero();

	InverseDynamics (model, Q, QDot, QDDot, (*C), f_ext);
	CompositeRigidBodyAlgorithm (model, Q, *H, false);

	LOG << "A = " << std::endl << *H << std::endl;
	LOG << "b = " << std::endl << *C * -1. + Tau << std::endl;

#ifndef RBDL_USE_SIMPLE_MATH
	switch (linear_solver) {
		case (LinearSolverPartialPivLU) :
			QDDot = H->partialPivLu().solve (*C * -1. + Tau);
			break;
		case (LinearSolverColPivHouseholderQR) :
			QDDot = H->colPivHouseholderQr().solve (*C * -1. + Tau);
			break;
		case (LinearSolverHouseholderQR) :
			QDDot = H->householderQr().solve (*C * -1. + Tau);
			break;
		case (LinearSolverLLT) :
			QDDot = H->llt().solve (*C * -1. + Tau);
			break;
		default:
			LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
			assert (0);
			break;
	}
#else
	bool solve_successful = LinSolveGaussElimPivot (*H, *C * -1. + Tau, QDDot);
	assert (solve_successful);
#endif

	if (free_C) {
		delete C;
	}

	if (free_H) {
		delete H;
	}


	LOG << "x = " << QDDot << std::endl;
}